

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O1

Int __thiscall
ipx::LpSolver::CrossoverFromStartingPoint
          (LpSolver *this,double *x_start,double *slack_start,double *y_start,double *z_start)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  Basis *this_00;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  Int IVar15;
  double dVar16;
  Timer timer;
  string local_50;
  
  iVar3 = (this->model_).num_rows_;
  sVar14 = (size_t)iVar3;
  iVar12 = (this->model_).num_cols_;
  ClearSolution(this);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Crossover from starting point\n","");
  Control::hLog(&this->control_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar13 = (long)iVar12 + sVar14;
  if ((this->x_crossover_)._M_size != uVar13) {
    operator_delete((this->x_crossover_)._M_data);
    (this->x_crossover_)._M_size = uVar13;
    pdVar9 = (double *)operator_new(uVar13 * 8);
    (this->x_crossover_)._M_data = pdVar9;
  }
  iVar12 = (int)uVar13;
  if (iVar12 != 0) {
    memset((this->x_crossover_)._M_data,0,uVar13 * 8);
  }
  if ((this->y_crossover_)._M_size != sVar14) {
    operator_delete((this->y_crossover_)._M_data);
    (this->y_crossover_)._M_size = sVar14;
    pdVar9 = (double *)operator_new(sVar14 * 8);
    (this->y_crossover_)._M_data = pdVar9;
  }
  if (iVar3 != 0) {
    memset((this->y_crossover_)._M_data,0,sVar14 * 8);
  }
  if ((this->z_crossover_)._M_size != uVar13) {
    operator_delete((this->z_crossover_)._M_data);
    (this->z_crossover_)._M_size = uVar13;
    pdVar9 = (double *)operator_new(uVar13 * 8);
    (this->z_crossover_)._M_data = pdVar9;
  }
  if (iVar12 != 0) {
    memset((this->z_crossover_)._M_data,0,uVar13 * 8);
  }
  if ((this->crossover_weights_)._M_size != 0) {
    operator_delete((this->crossover_weights_)._M_data);
    (this->crossover_weights_)._M_size = 0;
    pdVar9 = (double *)operator_new(0);
    (this->crossover_weights_)._M_data = pdVar9;
  }
  Model::PresolveStartingPoint
            (&this->model_,x_start,slack_start,y_start,z_start,&this->x_crossover_,
             &this->y_crossover_,&this->z_crossover_);
  if (0 < iVar12) {
    pdVar9 = (this->z_crossover_)._M_data;
    uVar10 = 0;
    do {
      dVar16 = (this->x_crossover_)._M_data[uVar10];
      dVar1 = (this->model_).lb_._M_data[uVar10];
      if (dVar16 < dVar1) {
        return 0x69;
      }
      dVar2 = (this->model_).ub_._M_data[uVar10];
      if (dVar2 < dVar16) {
        return 0x69;
      }
      if (((dVar16 != dVar1) || (NAN(dVar16) || NAN(dVar1))) && (0.0 < pdVar9[uVar10])) {
        return 0x69;
      }
      if (((dVar16 != dVar2) || (NAN(dVar16) || NAN(dVar2))) &&
         (pdVar5 = pdVar9 + uVar10, *pdVar5 <= 0.0 && *pdVar5 != 0.0)) {
        return 0x69;
      }
      uVar10 = uVar10 + 1;
    } while ((uVar13 & 0xffffffff) != uVar10);
  }
  this_00 = (Basis *)operator_new(0xb0);
  Basis::Basis(this_00,&this->control_,&this->model_);
  std::__uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>::reset
            ((__uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_> *)&this->basis_,this_00)
  ;
  if ((this->control_).parameters_.super_ipx_parameters.crash_basis != 0) {
    Timer::Timer(&timer);
    pdVar9 = (double *)operator_new(uVar13 * 8);
    memset(pdVar9,0,uVar13 * 8);
    if (0 < iVar12) {
      piVar4 = (this->model_).AI_.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->model_).lb_._M_data;
      pdVar6 = (this->model_).ub_._M_data;
      pdVar7 = (this->z_crossover_)._M_data;
      pdVar8 = (this->x_crossover_)._M_data;
      lVar11 = 0;
      do {
        dVar16 = *(double *)((long)pdVar5 + lVar11 * 2);
        dVar1 = *(double *)((long)pdVar6 + lVar11 * 2);
        if ((dVar16 != dVar1) || (NAN(dVar16) || NAN(dVar1))) {
          if (ABS(dVar1) == INFINITY && ABS(dVar16) == INFINITY) {
            *(undefined8 *)((long)pdVar9 + lVar11 * 2) = 0x7ff0000000000000;
          }
          else {
            dVar2 = *(double *)((long)pdVar7 + lVar11 * 2);
            if ((dVar2 != 0.0) || (NAN(dVar2))) goto LAB_003aa125;
            dVar2 = *(double *)((long)pdVar8 + lVar11 * 2);
            iVar12 = iVar3;
            if ((dVar2 != dVar16) || (NAN(dVar2) || NAN(dVar16))) {
              if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
                iVar12 = iVar3 * 2;
              }
            }
            *(double *)((long)pdVar9 + lVar11 * 2) =
                 (double)((*(int *)((long)piVar4 + lVar11) - *(int *)((long)piVar4 + lVar11 + 4)) +
                         iVar12 + 1);
          }
        }
        else {
LAB_003aa125:
          *(undefined8 *)((long)pdVar9 + lVar11 * 2) = 0;
        }
        lVar11 = lVar11 + 4;
      } while ((uVar13 & 0xffffffff) << 2 != lVar11);
    }
    Basis::ConstructBasisFromWeights
              ((this->basis_)._M_t.
               super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
               super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
               super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl,pdVar9,&this->info_);
    dVar16 = Timer::Elapsed(&timer);
    (this->info_).super_ipx_info.time_starting_basis =
         dVar16 + (this->info_).super_ipx_info.time_starting_basis;
    iVar3 = (this->info_).super_ipx_info.errflag;
    if (iVar3 == 0) {
      IVar15 = 0x69;
    }
    else {
      IVar15 = 0;
      ClearSolution(this);
    }
    operator_delete(pdVar9);
    if (iVar3 != 0) {
      return IVar15;
    }
  }
  RunCrossover(this);
  return 0;
}

Assistant:

Int LpSolver::CrossoverFromStartingPoint(const double* x_start,
                                         const double* slack_start,
                                         const double* y_start,
                                         const double* z_start) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    ClearSolution();
    control_.hLog("Crossover from starting point\n");

    x_crossover_.resize(n+m);
    y_crossover_.resize(m);
    z_crossover_.resize(n+m);
    crossover_weights_.resize(0);
    model_.PresolveStartingPoint(x_start, slack_start, y_start, z_start,
                                 x_crossover_, y_crossover_, z_crossover_);

    // Check that starting point is complementary and satisfies bound and sign
    // conditions.
    for (Int j = 0; j < n+m; j++) {
        if (x_crossover_[j] < lb[j] || x_crossover_[j] > ub[j])
            return IPX_ERROR_invalid_vector;
        if (x_crossover_[j] != lb[j] && z_crossover_[j] > 0.0)
            return IPX_ERROR_invalid_vector;
        if (x_crossover_[j] != ub[j] && z_crossover_[j] < 0.0)
            return IPX_ERROR_invalid_vector;
    }

    // Construct starting basis.
    basis_.reset(new Basis(control_, model_));
    if (control_.crash_basis()) {
        // Take columns in the following order of priority:
        // - free columns
        // - columns between their bounds, in increasing number of nonzeros
        // - columns with zero dual, in increasing number of nonzeros
        // - Fixed columns and those with nonzero dual
        Timer timer;
        Vector colweight(n+m);
        for (Int j = 0; j < n+m; j++) {
            Int nz = AI.entries(j);
            if (lb[j] == ub[j])
                colweight[j] = 0.0;
            else if (std::isinf(lb[j]) && std::isinf(ub[j]))
                colweight[j] = INFINITY;
            else if (z_crossover_[j] != 0.0)
                colweight[j] = 0.0;
            else if (x_crossover_[j] != lb[j] && x_crossover_[j] != ub[j])
                colweight[j] = m + (m-nz+1);
            else
                colweight[j] = m-nz+1;
        }
        basis_->ConstructBasisFromWeights(&colweight[0], &info_);
        info_.time_starting_basis += timer.Elapsed();
        if (info_.errflag) {
            ClearSolution();
            return 0;
        }
    }

    RunCrossover();
    return 0;
}